

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_istype(lua_State *L)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  CTypeID id;
  uint uVar4;
  TValue *pTVar5;
  CType *d;
  CType *s;
  int iVar6;
  CTypeID id_00;
  CTState *cts;
  bool bVar7;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts->L = L;
  id = ffi_checkctype(L,cts,(TValue *)0x0);
  pTVar5 = lj_lib_checkany(L,2);
  if ((pTVar5->field_2).it != 0xfffffff5) {
    iVar6 = -2;
    goto LAB_00146a10;
  }
  uVar1 = *(ushort *)((ulong)(pTVar5->u32).lo + 6);
  id_00 = (CTypeID)uVar1;
  if (uVar1 == 0x15) {
    id_00 = *(CTypeID *)((ulong)(pTVar5->u32).lo + 8);
  }
  d = lj_ctype_rawref(cts,id);
  s = lj_ctype_rawref(cts,id_00);
  if (d == s) {
    uVar4 = 1;
  }
  else {
    uVar2 = d->info;
    uVar3 = s->info;
    if ((uVar2 >> 0x1c == uVar3 >> 0x1c) && (d->size == s->size)) {
      if ((uVar2 & 0xe0000000) == 0x20000000) {
        uVar4 = lj_cconv_compatptr(cts,d,s,8);
      }
      else {
        uVar4 = 0;
        if (uVar2 < 0x10000000 || uVar2 >> 0x1c == 4) {
          bVar7 = ((uVar3 ^ uVar2) & 0xfcbfffff) == 0;
          goto LAB_00146a03;
        }
      }
    }
    else {
      uVar4 = 0;
      if (((uVar2 & 0xf0000000) == 0x10000000) && ((uVar3 & 0xf0000000) == 0x20000000)) {
        bVar7 = d == (CType *)((long)&cts->tab->info + (ulong)((uVar3 & 0xffff) << 4));
LAB_00146a03:
        uVar4 = (uint)bVar7;
      }
    }
  }
  iVar6 = -2 - uVar4;
LAB_00146a10:
  *(int *)((long)L->top + -4) = iVar6;
  *(int *)((ulong)(L->glref).ptr32 + 0xac) = iVar6;
  return 1;
}

Assistant:

LJLIB_CF(ffi_istype)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id1 = ffi_checkctype(L, cts, NULL);
  TValue *o = lj_lib_checkany(L, 2);
  int b = 0;
  if (tviscdata(o)) {
    GCcdata *cd = cdataV(o);
    CTypeID id2 = cd->ctypeid == CTID_CTYPEID ? *(CTypeID *)cdataptr(cd) :
						cd->ctypeid;
    CType *ct1 = lj_ctype_rawref(cts, id1);
    CType *ct2 = lj_ctype_rawref(cts, id2);
    if (ct1 == ct2) {
      b = 1;
    } else if (ctype_type(ct1->info) == ctype_type(ct2->info) &&
	       ct1->size == ct2->size) {
      if (ctype_ispointer(ct1->info))
	b = lj_cconv_compatptr(cts, ct1, ct2, CCF_IGNQUAL);
      else if (ctype_isnum(ct1->info) || ctype_isvoid(ct1->info))
	b = (((ct1->info ^ ct2->info) & ~(CTF_QUAL|CTF_LONG)) == 0);
    } else if (ctype_isstruct(ct1->info) && ctype_isptr(ct2->info) &&
	       ct1 == ctype_rawchild(cts, ct2)) {
      b = 1;
    }
  }
  setboolV(L->top-1, b);
  setboolV(&G(L)->tmptv2, b);  /* Remember for trace recorder. */
  return 1;
}